

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

void __thiscall
gtl::
dense_hashtable<S2CellIndex::LabelledCell,S2CellIndex::LabelledCell,S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,gtl::dense_hash_set<S2CellIndex::LabelledCell,S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,std::equal_to<S2CellIndex::LabelledCell>,std::allocator<S2CellIndex::LabelledCell>>::Identity,gtl::dense_hash_set<S2CellIndex::LabelledCell,S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,std::equal_to<S2CellIndex::LabelledCell>,std::allocator<S2CellIndex::LabelledCell>>::SetKey,std::equal_to<S2CellIndex::LabelledCell>,std::allocator<S2CellIndex::LabelledCell>>
::
copy_elements<std::move_iterator<gtl::dense_hashtable_iterator<S2CellIndex::LabelledCell,S2CellIndex::LabelledCell,S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,gtl::dense_hash_set<S2CellIndex::LabelledCell,S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,std::equal_to<S2CellIndex::LabelledCell>,std::allocator<S2CellIndex::LabelledCell>>::Identity,gtl::dense_hash_set<S2CellIndex::LabelledCell,S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,std::equal_to<S2CellIndex::LabelledCell>,std::allocator<S2CellIndex::LabelledCell>>::SetKey,std::equal_to<S2CellIndex::LabelledCell>,std::allocator<S2CellIndex::LabelledCell>>>>
          (dense_hashtable<S2CellIndex::LabelledCell,S2CellIndex::LabelledCell,S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,gtl::dense_hash_set<S2CellIndex::LabelledCell,S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,std::equal_to<S2CellIndex::LabelledCell>,std::allocator<S2CellIndex::LabelledCell>>::Identity,gtl::dense_hash_set<S2CellIndex::LabelledCell,S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,std::equal_to<S2CellIndex::LabelledCell>,std::allocator<S2CellIndex::LabelledCell>>::SetKey,std::equal_to<S2CellIndex::LabelledCell>,std::allocator<S2CellIndex::LabelledCell>>
           *this,move_iterator<gtl::dense_hashtable_iterator<S2CellIndex::LabelledCell,_S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::Identity,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::SetKey,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>_>
                 src_first,
          move_iterator<gtl::dense_hashtable_iterator<S2CellIndex::LabelledCell,_S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::Identity,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::SetKey,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>_>
          src_last,pointer dest_table,size_type dest_bucket_count)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((dest_bucket_count & dest_bucket_count - 1) != 0) {
    __assert_fail("(dest_bucket_count & (dest_bucket_count - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                  ,0x2b4,
                  "void gtl::dense_hashtable<S2CellIndex::LabelledCell, S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash, gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::Identity, gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::SetKey, std::equal_to<S2CellIndex::LabelledCell>, std::allocator<S2CellIndex::LabelledCell>>::copy_elements(Iter, Iter, pointer, size_type) [Value = S2CellIndex::LabelledCell, Key = S2CellIndex::LabelledCell, HashFcn = S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash, ExtractKey = gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::Identity, SetKey = gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::SetKey, EqualKey = std::equal_to<S2CellIndex::LabelledCell>, Alloc = std::allocator<S2CellIndex::LabelledCell>, Iter = std::move_iterator<gtl::dense_hashtable_iterator<S2CellIndex::LabelledCell, S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash, gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::Identity, gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::SetKey, std::equal_to<S2CellIndex::LabelledCell>, std::allocator<S2CellIndex::LabelledCell>>>]"
                 );
  }
  do {
    if (src_first._M_current.pos == src_last._M_current.pos) {
      return;
    }
    lVar2 = ((src_first._M_current.pos)->cell_id).id_ + 0x53;
    uVar4 = ((ulong)(lVar2 * -0x23c146b50754b36d) >> 0x2d) +
            lVar2 * -0x35a83aa59b680000 + (long)(src_first._M_current.pos)->label;
    uVar3 = 0;
    while( true ) {
      uVar4 = uVar4 & dest_bucket_count - 1;
      bVar1 = dense_hashtable<S2CellIndex::LabelledCell,_S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::Identity,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::SetKey,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>
              ::test_empty((dense_hashtable<S2CellIndex::LabelledCell,_S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::Identity,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::SetKey,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>
                            *)this,uVar4,dest_table);
      if (bVar1) break;
      uVar4 = uVar4 + uVar3 + 1;
      uVar3 = uVar3 + 1;
      if (dest_bucket_count <= uVar3) {
        __assert_fail("num_probes < dest_bucket_count && \"Hashtable is full: an error in key_equal<> or hash<>\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                      ,0x2c2,
                      "void gtl::dense_hashtable<S2CellIndex::LabelledCell, S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash, gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::Identity, gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::SetKey, std::equal_to<S2CellIndex::LabelledCell>, std::allocator<S2CellIndex::LabelledCell>>::copy_elements(Iter, Iter, pointer, size_type) [Value = S2CellIndex::LabelledCell, Key = S2CellIndex::LabelledCell, HashFcn = S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash, ExtractKey = gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::Identity, SetKey = gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::SetKey, EqualKey = std::equal_to<S2CellIndex::LabelledCell>, Alloc = std::allocator<S2CellIndex::LabelledCell>, Iter = std::move_iterator<gtl::dense_hashtable_iterator<S2CellIndex::LabelledCell, S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash, gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::Identity, gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::SetKey, std::equal_to<S2CellIndex::LabelledCell>, std::allocator<S2CellIndex::LabelledCell>>>]"
                     );
      }
    }
    dest_table[uVar4].label = (src_first._M_current.pos)->label;
    dest_table[uVar4].cell_id.id_ = ((src_first._M_current.pos)->cell_id).id_;
    dense_hashtable_iterator<S2CellIndex::LabelledCell,_S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::Identity,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::SetKey,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>
    ::operator++(&src_first._M_current);
  } while( true );
}

Assistant:

void copy_elements(Iter src_first, Iter src_last, pointer dest_table,
                     size_type dest_bucket_count) {
    assert((dest_bucket_count & (dest_bucket_count - 1)) == 0);  // a power of 2
    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    for (; src_first != src_last; ++src_first) {
      size_type num_probes = 0;               // how many times we've probed
      size_type bucknum;
      const size_type bucket_count_minus_one = dest_bucket_count - 1;
      for (bucknum = hash(get_key(*src_first)) & bucket_count_minus_one;
           !test_empty(bucknum, dest_table);  // not empty
           bucknum = (bucknum +
                      JUMP_(key, num_probes)) & bucket_count_minus_one) {
        ++num_probes;
        assert(num_probes < dest_bucket_count
               && "Hashtable is full: an error in key_equal<> or hash<>");
      }
      // Copies or moves the value into dest_table.
      set_value(&dest_table[bucknum], *src_first);
    }
  }